

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_resolve(idr *idr,_func_void_uchar_ptr_int *fsetnum)

{
  int iVar1;
  long lVar2;
  int iVar3;
  idrent *in_RSI;
  long in_RDI;
  archive_rb_node *unaff_retaddr;
  uchar *p;
  idrent *n;
  long lVar4;
  
  for (lVar4 = *(long *)(in_RDI + 0x18); lVar4 != 0; lVar4 = *(long *)(lVar4 + 0x18)) {
    idr_extend_identifier(in_RSI,(int)((ulong)lVar4 >> 0x20),(int)lVar4);
    lVar2 = *(long *)(*(long *)(lVar4 + 0x28) + 0xa8);
    iVar1 = *(int *)(lVar4 + 0x34);
    do {
      *(int *)(*(long *)(lVar4 + 0x20) + 0x38) = *(int *)(*(long *)(lVar4 + 0x20) + 0x38) + 1;
      (*(code *)in_RSI)(lVar2 + iVar1);
      iVar3 = __archive_rb_tree_insert_node((archive_rb_tree *)p,unaff_retaddr);
    } while (iVar3 == 0);
  }
  return;
}

Assistant:

static void
idr_resolve(struct idr *idr, void (*fsetnum)(unsigned char *p, int num))
{
	struct idrent *n;
	unsigned char *p;

	for (n = idr->wait_list.first; n != NULL; n = n->wnext) {
		idr_extend_identifier(n, idr->num_size, idr->null_size);
		p = (unsigned char *)n->isoent->identifier + n->noff;
		do {
			fsetnum(p, n->avail->rename_num++);
		} while (!__archive_rb_tree_insert_node(
		    &(idr->rbtree), &(n->rbnode)));
	}
}